

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolormap.cpp
# Opt level: O0

uint __thiscall QColormap::pixel(QColormap *this,QColor *color)

{
  int iVar1;
  ushort uVar2;
  QRgb rgb_00;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  long *in_RDI;
  int tr;
  int tg;
  int blue_mask;
  int green_mask;
  int red_mask;
  int green_shift;
  int red_shift;
  int b;
  int g;
  int r;
  QRgb rgb;
  
  rgb_00 = QColor::rgba();
  if (*(int *)(*in_RDI + 4) == 0) {
    iVar1 = *(int *)(*in_RDI + 8);
    if (iVar1 == 0x10) {
      uVar2 = qt_convRgbTo16((QRgb)((ulong)in_RDI >> 0x20));
      return (uint)uVar2;
    }
    if ((iVar1 == 0x18) || (iVar1 == 0x20)) {
      uVar3 = qRed(rgb_00);
      uVar4 = qGreen(rgb_00);
      uVar5 = qBlue(rgb_00);
      return uVar5 & 0xff | 0xff000000 | (uVar4 & 0xff) << 8 | (uVar3 & 0xff) << 0x10;
    }
  }
  return 0;
}

Assistant:

uint QColormap::pixel(const QColor &color) const
{
    QRgb rgb = color.rgba();
    if (d->mode == QColormap::Direct) {
        switch(d->depth) {
        case 16:
            return qt_convRgbTo16(rgb);
        case 24:
        case 32:
        {
            const int r = qRed(rgb);
            const int g = qGreen(rgb);
            const int b = qBlue(rgb);
            const int red_shift = 16;
            const int green_shift = 8;
            const int red_mask   = 0xff0000;
            const int green_mask = 0x00ff00;
            const int blue_mask  = 0x0000ff;
            const int tg = g << green_shift;
            const int tr = r << red_shift;
            return 0xff000000 | (b & blue_mask) | (tg & green_mask) | (tr & red_mask);
        }
        }
    }
    //XXX
    //return qt_screen->alloc(qRed(rgb), qGreen(rgb), qBlue(rgb));
    return 0;
}